

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# user_geometry_device.cpp
# Opt level: O0

Vec3fa embree::renderPixelStandard
                 (TutorialData *data,float x,float y,ISPCCamera *camera,RayStats *stats)

{
  long lVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  int *in_RCX;
  float *in_RDX;
  long in_RSI;
  ulong *in_RDI;
  float in_XMM0_Da;
  float fVar10;
  float fVar11;
  ulong uVar12;
  float in_XMM1_Da;
  ulong extraout_XMM1_Qa;
  ulong uVar13;
  Vec3fa VVar14;
  RTCOccludedArguments sargs;
  Ray shadow;
  Vec3fa lightDir;
  Vec3fa diffuse;
  Vec3fa Ns;
  RTCIntersectArguments iargs;
  Ray ray;
  Vec3fa *color;
  vfloat4 c_1;
  vfloat4 b;
  vfloat4 a_1;
  vfloat4 c_3;
  vfloat4 b_1;
  vfloat4 a_3;
  vfloat4 c_5;
  vfloat4 b_2;
  vfloat4 a_5;
  vint4 mask_4;
  vint4 mask_3;
  vint4 mask_1;
  vint4 mask;
  __m128 c_2;
  __m128 r_1;
  __m128 a_2;
  __m128 c_4;
  __m128 r_2;
  __m128 a_4;
  __m128 c;
  __m128 r;
  __m128 a;
  __m128 mask_2;
  float local_24a0;
  float local_249c;
  undefined4 local_2418;
  undefined4 local_2414;
  undefined8 local_2410;
  undefined8 local_2408;
  undefined8 local_2400;
  undefined1 local_23f8 [8];
  ulong uStack_23f0;
  undefined8 local_23e8;
  undefined8 uStack_23e0;
  undefined8 local_23d8;
  ulong uStack_23d0;
  undefined8 local_23c8;
  ulong uStack_23c0;
  undefined8 local_23b8;
  ulong uStack_23b0;
  undefined1 local_23a8 [8];
  ulong uStack_23a0;
  float local_2398;
  undefined4 local_2394;
  undefined1 auStack_2388 [20];
  undefined4 local_2374;
  undefined4 local_2370;
  undefined4 local_236c;
  undefined4 local_2368;
  undefined8 local_2358;
  undefined8 uStack_2350;
  float local_2348;
  float fStack_2344;
  ulong uStack_2340;
  undefined8 local_2338;
  undefined8 uStack_2330;
  ulong local_2328;
  ulong uStack_2320;
  undefined8 local_2318;
  undefined8 uStack_2310;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_2308;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_22f8;
  undefined8 local_22e8;
  undefined8 uStack_22e0;
  undefined1 local_22d8 [4];
  float fStack_22d4;
  ulong uStack_22d0;
  undefined8 local_22c8;
  ulong uStack_22c0;
  undefined8 local_22b8;
  ulong uStack_22b0;
  undefined4 local_22a8;
  undefined4 local_22a4;
  undefined8 local_22a0;
  undefined8 local_2298;
  undefined8 local_2290;
  float local_2284 [3];
  float local_2278 [3];
  float local_226c [3];
  float local_2260 [3];
  float local_2254 [3];
  undefined8 local_2248;
  ulong uStack_2240;
  undefined8 local_2238;
  ulong uStack_2230;
  undefined8 local_2228;
  ulong uStack_2220;
  undefined8 local_2218;
  ulong uStack_2210;
  float local_2208;
  undefined4 local_2204;
  float local_21f8;
  undefined4 local_21f4;
  uint local_21f0;
  uint local_21e4;
  int local_21e0;
  uint local_21dc;
  undefined4 local_21d8;
  int *local_21c8;
  undefined1 local_21b8 [4];
  undefined1 local_21b4 [4];
  long local_21b0;
  undefined8 *local_21a0;
  undefined1 *local_2198;
  undefined4 local_218c;
  undefined4 local_2188;
  undefined4 local_2184;
  undefined8 *local_2180;
  undefined8 *local_2178;
  undefined8 *local_2170;
  undefined8 *local_2168;
  anon_union_16_2_47237d3f_for_Vec3fa_0 *local_2160;
  ulong *local_2148;
  undefined8 *local_2138;
  undefined8 *local_2130;
  undefined8 *local_2128;
  undefined8 *local_2120;
  undefined8 *local_2118;
  undefined8 *local_2110;
  embree *local_2108;
  undefined8 *local_2100;
  undefined8 *local_20f8;
  undefined8 *local_20f0;
  undefined8 *local_20c0;
  undefined8 *local_20b8;
  undefined8 *local_20b0;
  undefined8 local_20a8;
  undefined8 uStack_20a0;
  undefined8 *local_2098;
  float local_208c;
  undefined8 *local_2088;
  float *local_2068;
  undefined8 *local_2060;
  float *local_2058;
  undefined8 *local_2050;
  float *local_2048;
  undefined8 *local_2040;
  float local_2034;
  float *local_2030;
  float *local_2028;
  float local_201c;
  float local_2018;
  float local_2014;
  float *local_2010;
  float *local_2008;
  float *local_2000;
  float local_1ff4;
  float local_1ff0;
  float local_1fec;
  float *local_1fe8;
  float *local_1fe0;
  float *local_1fd8;
  float local_1fcc;
  float local_1fc8;
  float local_1fc4;
  float *local_1fc0;
  undefined1 *local_1fb8;
  float *local_1fb0;
  float local_1fa4;
  float local_1fa0;
  float local_1f9c [3];
  undefined1 *local_1f90;
  float *local_1f88;
  undefined1 *local_1f80;
  undefined1 *local_1f78;
  undefined4 local_1f70;
  undefined4 local_1f6c;
  undefined4 local_1f68;
  undefined4 local_1f64;
  float local_1f60;
  undefined4 local_1f5c;
  undefined8 *local_1f58;
  undefined8 *local_1f50;
  undefined8 *local_1f48;
  undefined4 local_1f40;
  undefined4 local_1f3c;
  undefined4 local_1f38;
  undefined4 local_1f34;
  float local_1f30;
  undefined4 local_1f2c;
  undefined1 *local_1f28;
  undefined8 *local_1f20;
  undefined8 *local_1f18;
  undefined4 *local_1f10;
  undefined8 *local_1f08;
  int *local_1f00;
  undefined4 local_1ef4;
  undefined4 local_1ee4;
  undefined8 *local_1ee0;
  undefined8 local_1ed8;
  undefined8 uStack_1ed0;
  undefined8 local_1ec8;
  undefined8 uStack_1ec0;
  undefined1 local_1eb8 [16];
  undefined8 local_1ea8;
  undefined8 uStack_1ea0;
  undefined1 local_1e98 [24];
  undefined1 *local_1e80;
  undefined8 *local_1e78;
  undefined8 *local_1e70;
  undefined1 *local_1e60;
  undefined1 *local_1e50;
  float local_1e44;
  undefined8 *local_1e40;
  undefined8 *local_1e38;
  float *local_1e30;
  undefined8 local_1e28;
  undefined8 uStack_1e20;
  undefined8 *local_1e18;
  undefined8 *local_1e10;
  undefined8 *local_1e08;
  anon_union_16_2_47237d3f_for_Vec3fa_0 *local_1e00;
  undefined8 local_1df8;
  undefined8 uStack_1df0;
  undefined8 *local_1de8;
  undefined8 *local_1de0;
  undefined8 *local_1dc0;
  ulong *local_1db0;
  undefined8 local_1da8;
  undefined8 uStack_1da0;
  float local_1d8c;
  undefined8 *local_1d88;
  anon_union_16_2_47237d3f_for_Vec3fa_0 *local_1d80;
  float local_1d74;
  undefined8 *local_1d70;
  undefined8 local_1d68;
  undefined8 uStack_1d60;
  float local_1d4c;
  undefined8 *local_1d48;
  float *local_1d40;
  float local_1d34;
  undefined8 *local_1d30;
  undefined8 local_1ce8;
  undefined8 uStack_1ce0;
  undefined4 local_1cd4;
  undefined8 *local_1cd0;
  undefined8 *local_1cc8;
  undefined4 local_1cbc;
  undefined8 *local_1cb8;
  float *local_1cb0;
  undefined1 *local_1ca8;
  undefined4 *local_1ca0;
  undefined8 *local_1c98;
  ulong uStack_1c80;
  undefined4 local_1c6c;
  undefined8 local_1c68;
  ulong uStack_1c60;
  float local_1c58;
  undefined4 local_1c4c;
  undefined8 local_1c48;
  ulong uStack_1c40;
  float local_1c38;
  float local_1c34;
  float local_1c30;
  undefined4 local_1c2c;
  undefined8 local_1c28;
  undefined8 uStack_1c20;
  undefined4 local_1c18;
  undefined4 local_1c14;
  undefined4 local_1c10;
  undefined4 local_1c0c;
  float local_1c08;
  float fStack_1c04;
  float fStack_1c00;
  float fStack_1bfc;
  ulong *local_1bf0;
  undefined8 local_1bc8;
  ulong uStack_1bc0;
  anon_union_16_2_47237d3f_for_Vec3fa_0 *local_1bb0;
  undefined8 local_1ba8;
  ulong uStack_1ba0;
  undefined8 *local_1b98;
  undefined8 *local_1b90;
  undefined8 *local_1b88;
  undefined8 *local_1b80;
  undefined8 local_1b78;
  undefined8 uStack_1b70;
  undefined8 local_1b68;
  undefined8 uStack_1b60;
  float local_1b48;
  float fStack_1b44;
  float fStack_1b40;
  float fStack_1b3c;
  undefined8 local_1b38;
  undefined8 uStack_1b30;
  undefined8 local_1b28;
  undefined8 uStack_1b20;
  undefined8 local_1b18;
  undefined8 uStack_1b10;
  undefined8 local_1b08;
  undefined8 uStack_1b00;
  float local_1af8;
  float fStack_1af4;
  float fStack_1af0;
  float fStack_1aec;
  undefined8 *local_1ae0;
  float local_1ad8;
  float fStack_1ad4;
  float fStack_1ad0;
  float fStack_1acc;
  undefined8 *local_1ac0;
  undefined8 local_1ab8;
  undefined8 uStack_1ab0;
  undefined8 local_1aa8;
  undefined8 uStack_1aa0;
  undefined8 local_1a98;
  undefined8 uStack_1a90;
  undefined8 local_1a88;
  undefined8 uStack_1a80;
  undefined8 local_1a78;
  undefined8 uStack_1a70;
  undefined8 *local_1a60;
  undefined8 local_1a58;
  undefined8 uStack_1a50;
  undefined8 *local_1a40;
  undefined8 *local_1a38;
  undefined8 *local_1a30;
  undefined8 *local_1a28;
  undefined8 *local_1a20;
  undefined8 local_1a18;
  undefined8 uStack_1a10;
  undefined8 *local_1a00;
  undefined8 *local_19f8;
  undefined8 *local_19f0;
  float local_19e8;
  float fStack_19e4;
  float fStack_19e0;
  float fStack_19dc;
  undefined8 *local_19d8;
  undefined8 *local_19d0;
  undefined8 *local_19c8;
  undefined8 *local_19c0;
  float local_19b8;
  float fStack_19b4;
  float fStack_19b0;
  float fStack_19ac;
  undefined8 *local_19a8;
  undefined8 *local_19a0;
  undefined8 *local_1998;
  undefined8 *local_1990;
  undefined8 local_1988;
  undefined8 uStack_1980;
  undefined8 *local_1970;
  float local_1968;
  float fStack_1964;
  float fStack_1960;
  float fStack_195c;
  undefined8 local_1958;
  undefined8 uStack_1950;
  undefined8 *local_1940;
  undefined8 *local_1938;
  undefined8 *local_1930;
  undefined8 *local_1928;
  undefined8 *local_1920;
  undefined8 *local_1918;
  undefined8 *local_1910;
  undefined8 local_1908;
  undefined8 uStack_1900;
  undefined8 *local_18f0;
  float local_18e8;
  float fStack_18e4;
  float fStack_18e0;
  float fStack_18dc;
  undefined8 local_18d8;
  undefined8 uStack_18d0;
  undefined8 *local_18c0;
  undefined8 local_18b8;
  undefined8 uStack_18b0;
  undefined8 local_18a8;
  undefined8 uStack_18a0;
  undefined8 local_1898;
  undefined8 uStack_1890;
  undefined8 local_1888;
  undefined8 uStack_1880;
  undefined8 local_1878;
  undefined8 uStack_1870;
  undefined8 local_1868;
  undefined8 uStack_1860;
  undefined8 local_1858;
  undefined8 uStack_1850;
  undefined8 local_1848;
  undefined8 uStack_1840;
  undefined8 local_1838;
  undefined8 uStack_1830;
  undefined8 *local_1820;
  undefined8 local_1818;
  undefined8 uStack_1810;
  undefined8 *local_1800;
  undefined8 *local_17f8;
  undefined8 *local_17f0;
  undefined8 *local_17e8;
  undefined8 *local_17e0;
  undefined8 local_17d8;
  undefined8 uStack_17d0;
  undefined8 *local_17c0;
  undefined8 *local_17b8;
  undefined8 *local_17b0;
  undefined4 local_17a8;
  undefined4 uStack_17a4;
  undefined4 uStack_17a0;
  undefined4 uStack_179c;
  undefined8 *local_1798;
  undefined8 *local_1790;
  undefined8 *local_1788;
  undefined8 *local_1780;
  undefined4 local_1778;
  undefined4 uStack_1774;
  undefined4 uStack_1770;
  undefined4 uStack_176c;
  undefined8 *local_1768;
  undefined8 *local_1760;
  undefined8 *local_1758;
  undefined8 *local_1750;
  undefined8 local_1748;
  undefined8 uStack_1740;
  undefined8 *local_1730;
  undefined4 local_1728;
  undefined4 uStack_1724;
  undefined4 uStack_1720;
  undefined4 uStack_171c;
  undefined8 local_1718;
  undefined8 uStack_1710;
  undefined8 *local_1700;
  undefined8 *local_16f8;
  undefined8 *local_16f0;
  undefined8 *local_16e8;
  undefined8 *local_16e0;
  undefined8 *local_16d8;
  undefined8 *local_16d0;
  undefined8 local_16c8;
  undefined8 uStack_16c0;
  undefined8 *local_16b0;
  undefined4 local_16a8;
  undefined4 uStack_16a4;
  undefined4 uStack_16a0;
  undefined4 uStack_169c;
  undefined8 local_1698;
  undefined8 uStack_1690;
  undefined8 *local_1680;
  undefined8 local_1678;
  undefined8 uStack_1670;
  undefined8 local_1668;
  undefined8 uStack_1660;
  undefined8 local_1658;
  undefined8 uStack_1650;
  undefined8 local_1648;
  undefined8 uStack_1640;
  undefined8 *local_13f0;
  undefined8 *local_13e8;
  undefined8 *local_13e0;
  float local_13d8;
  float fStack_13d4;
  float fStack_13d0;
  float fStack_13cc;
  undefined8 *local_13c0;
  undefined8 local_13b8;
  undefined8 uStack_13b0;
  undefined8 local_13a8;
  undefined8 uStack_13a0;
  float local_1348;
  float fStack_1344;
  float fStack_1340;
  float fStack_133c;
  undefined8 *local_1330;
  undefined8 *local_1328;
  float *local_1320;
  float local_1318;
  float fStack_1314;
  float fStack_1310;
  float fStack_130c;
  float *local_1300;
  undefined8 local_12f8;
  undefined8 uStack_12f0;
  undefined8 local_12e8;
  undefined8 uStack_12e0;
  undefined8 *local_12d0;
  undefined8 *local_12c8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 *local_12c0;
  float local_12b8;
  float fStack_12b4;
  float fStack_12b0;
  float fStack_12ac;
  anon_union_16_2_47237d3f_for_Vec3fa_0 *local_12a0;
  undefined8 local_1298;
  undefined8 uStack_1290;
  undefined8 local_1288;
  ulong uStack_1280;
  undefined8 *local_1270;
  undefined8 *local_1268;
  undefined8 *local_1260;
  float local_1258;
  float fStack_1254;
  float fStack_1250;
  float fStack_124c;
  undefined8 *local_1240;
  undefined8 local_1238;
  ulong uStack_1230;
  undefined8 local_1228;
  undefined8 uStack_1220;
  undefined8 *local_1210;
  undefined8 *local_1208;
  undefined8 *local_1200;
  undefined4 local_11f8;
  undefined4 uStack_11f4;
  undefined4 uStack_11f0;
  undefined4 uStack_11ec;
  undefined8 *local_11e0;
  undefined8 local_11d8;
  undefined8 uStack_11d0;
  undefined8 local_11c8;
  undefined8 uStack_11c0;
  undefined8 *local_11b0;
  undefined8 *local_11a8;
  undefined8 *local_11a0;
  float local_1198;
  float fStack_1194;
  float fStack_1190;
  float fStack_118c;
  undefined8 *local_1180;
  undefined8 local_1178;
  undefined8 uStack_1170;
  undefined8 local_1168;
  undefined8 uStack_1160;
  float local_1118;
  float fStack_1114;
  float fStack_1110;
  float fStack_1100;
  float local_10f4;
  undefined8 *local_10f0;
  float local_10e8;
  float fStack_10e4;
  float fStack_10e0;
  float fStack_10dc;
  float local_10cc;
  undefined4 local_10c8;
  undefined4 uStack_10c4;
  undefined4 uStack_10c0;
  undefined4 uStack_10bc;
  undefined4 local_10ac;
  float local_1088;
  float fStack_1084;
  float fStack_1080;
  float fStack_107c;
  float local_106c;
  float local_1068;
  float fStack_1064;
  float fStack_1060;
  float fStack_105c;
  float local_104c;
  float local_1048;
  float fStack_1044;
  float fStack_1040;
  float fStack_103c;
  float local_1038;
  undefined4 local_fe8;
  undefined4 uStack_fe4;
  undefined4 uStack_fe0;
  undefined4 uStack_fdc;
  undefined4 local_fd8;
  undefined4 local_fc8;
  undefined4 uStack_fc4;
  undefined4 uStack_fc0;
  undefined4 uStack_fbc;
  undefined4 local_fb8;
  undefined8 local_fa8;
  undefined8 uStack_fa0;
  undefined1 local_f98 [8];
  ulong uStack_f90;
  undefined8 local_f88;
  undefined8 uStack_f80;
  undefined1 local_f78 [8];
  ulong uStack_f70;
  undefined8 local_f68;
  undefined8 uStack_f60;
  undefined4 local_f4c;
  undefined1 *local_f48;
  undefined1 *local_f40;
  ulong uStack_f30;
  undefined1 *local_f28;
  undefined1 *local_f20;
  undefined8 local_f18;
  undefined8 uStack_f10;
  undefined8 local_f08;
  undefined8 uStack_f00;
  undefined8 local_ef8;
  ulong uStack_ef0;
  undefined8 local_ee8;
  undefined8 uStack_ee0;
  undefined8 local_ed8;
  ulong uStack_ed0;
  undefined8 local_ec8;
  undefined8 uStack_ec0;
  undefined4 local_eac;
  undefined8 *local_ea8;
  undefined8 *local_ea0;
  undefined8 local_e98;
  ulong uStack_e90;
  undefined8 *local_e88;
  undefined8 *local_e80;
  undefined8 local_e78;
  undefined8 uStack_e70;
  undefined8 local_e68;
  undefined8 uStack_e60;
  undefined8 local_e58;
  ulong uStack_e50;
  undefined8 local_e48;
  undefined8 uStack_e40;
  undefined8 local_e38;
  ulong uStack_e30;
  undefined8 local_e28;
  undefined8 uStack_e20;
  undefined4 local_e0c;
  undefined8 *local_e08;
  undefined8 *local_e00;
  undefined8 local_df8;
  ulong uStack_df0;
  undefined8 *local_de8;
  undefined8 *local_de0;
  undefined8 local_dd8;
  undefined8 uStack_dd0;
  undefined8 local_dc8;
  undefined8 uStack_dc0;
  undefined8 local_db8;
  ulong uStack_db0;
  undefined8 local_da8;
  undefined8 uStack_da0;
  undefined8 local_d98;
  ulong uStack_d90;
  undefined8 local_d88;
  undefined8 uStack_d80;
  undefined4 local_d6c;
  undefined8 *local_d68;
  undefined8 *local_d60;
  undefined8 local_d58;
  ulong uStack_d50;
  undefined8 *local_d48;
  undefined8 *local_d40;
  undefined8 local_d38;
  undefined8 uStack_d30;
  undefined1 *local_d28;
  float *local_d20;
  undefined4 local_d18;
  undefined4 local_d14;
  undefined4 local_d10;
  undefined4 local_d0c;
  undefined8 *local_d08;
  undefined4 local_d00;
  undefined4 local_cfc;
  undefined4 local_cf8;
  undefined4 local_cf4;
  undefined8 *local_cf0;
  undefined4 local_ce8;
  undefined4 local_ce4;
  undefined4 local_ce0;
  undefined4 local_cdc;
  undefined8 *local_cd8;
  undefined4 local_cd0;
  undefined4 local_ccc;
  undefined4 local_cc8;
  undefined4 local_cc4;
  undefined8 *local_cc0;
  undefined8 *local_cb8;
  undefined8 *local_cb0;
  undefined8 *local_ca8;
  undefined8 *local_ca0;
  undefined8 local_c98;
  ulong uStack_c90;
  undefined8 *local_c80;
  undefined8 *local_c78;
  undefined8 *local_c70;
  undefined8 *local_c68;
  undefined8 *local_c60;
  undefined8 *local_c58;
  undefined8 *local_c50;
  undefined8 local_c48;
  ulong uStack_c40;
  undefined8 *local_c30;
  undefined8 *local_c28;
  undefined8 *local_c20;
  undefined8 *local_c18;
  undefined8 *local_c10;
  undefined8 *local_c08;
  undefined8 *local_c00;
  undefined8 local_bf8;
  ulong uStack_bf0;
  undefined8 *local_be0;
  undefined8 *local_bd8;
  undefined8 *local_bd0;
  undefined8 *local_bc8;
  undefined1 *local_bc0;
  undefined8 *local_bb8;
  undefined1 *local_bb0;
  ulong uStack_ba0;
  undefined1 *local_b90;
  undefined8 *local_b88;
  undefined1 *local_b80;
  undefined8 *local_b78;
  undefined8 *local_b70;
  undefined8 *local_b68;
  undefined8 *local_b60;
  undefined8 local_b58;
  undefined8 uStack_b50;
  undefined8 *local_b40;
  undefined8 local_b38;
  undefined8 uStack_b30;
  undefined8 *local_b20;
  undefined8 local_b18;
  undefined8 uStack_b10;
  undefined8 *local_b00;
  undefined8 local_af8;
  undefined8 uStack_af0;
  undefined8 *local_ae0;
  undefined4 local_ad4;
  undefined8 *local_ad0;
  undefined4 local_ac8;
  undefined4 uStack_ac4;
  undefined4 uStack_ac0;
  undefined4 uStack_abc;
  undefined4 local_ab8;
  undefined4 local_ab4;
  undefined8 *local_ab0;
  undefined4 local_aa8;
  undefined4 uStack_aa4;
  undefined4 uStack_aa0;
  undefined4 uStack_a9c;
  undefined4 local_a98;
  undefined4 local_a94;
  undefined8 *local_a90;
  undefined4 local_a88;
  undefined4 uStack_a84;
  undefined4 uStack_a80;
  undefined4 uStack_a7c;
  undefined4 local_a78;
  undefined4 local_a74;
  undefined8 *local_a70;
  undefined4 local_a68;
  undefined4 uStack_a64;
  undefined4 uStack_a60;
  undefined4 uStack_a5c;
  undefined4 local_a4c;
  undefined8 local_a48;
  undefined8 uStack_a40;
  undefined4 local_a38;
  undefined4 local_a34;
  undefined4 local_a30;
  undefined4 local_a2c;
  undefined8 local_a28;
  undefined8 uStack_a20;
  undefined4 local_a18;
  undefined4 local_a14;
  undefined4 local_a10;
  undefined4 local_a0c;
  undefined8 local_a08;
  undefined8 uStack_a00;
  undefined4 local_9f8;
  undefined4 local_9f4;
  undefined4 local_9f0;
  undefined4 local_9ec;
  undefined8 local_9e8;
  undefined8 uStack_9e0;
  undefined4 local_9d8;
  undefined4 local_9d4;
  undefined4 local_9d0;
  undefined4 local_9cc;
  undefined4 local_9c8;
  undefined4 uStack_9c4;
  undefined4 uStack_9c0;
  undefined4 uStack_9bc;
  ulong uStack_9b0;
  undefined8 local_9a8;
  undefined8 uStack_9a0;
  undefined8 local_998;
  ulong uStack_990;
  undefined8 local_988;
  undefined8 uStack_980;
  undefined8 local_978;
  ulong uStack_970;
  undefined8 local_968;
  undefined8 uStack_960;
  undefined8 local_958;
  ulong uStack_950;
  ulong uStack_940;
  undefined8 local_938;
  undefined8 uStack_930;
  undefined8 local_928;
  ulong uStack_920;
  undefined8 local_918;
  undefined8 uStack_910;
  undefined8 local_908;
  ulong uStack_900;
  undefined8 local_8f8;
  undefined8 uStack_8f0;
  undefined8 local_8e8;
  ulong uStack_8e0;
  undefined8 local_8d8;
  undefined8 uStack_8d0;
  undefined8 *local_8c8;
  undefined8 *local_8c0;
  undefined8 *local_8b8;
  undefined8 *local_8b0;
  undefined8 *local_8a8;
  undefined8 *local_8a0;
  undefined8 *local_898;
  undefined8 *local_890;
  undefined8 local_888;
  undefined8 uStack_880;
  undefined8 local_878;
  undefined8 uStack_870;
  undefined8 local_868;
  undefined8 uStack_860;
  undefined8 local_858;
  undefined8 uStack_850;
  undefined8 local_848;
  undefined8 uStack_840;
  undefined8 local_838;
  undefined8 uStack_830;
  undefined8 local_828;
  undefined8 uStack_820;
  undefined8 local_818;
  undefined8 uStack_810;
  ulong local_808;
  undefined8 uStack_800;
  undefined1 local_7f8 [16];
  ulong local_7e8;
  undefined8 uStack_7e0;
  float local_7cc;
  ulong local_7c8;
  undefined8 uStack_7c0;
  undefined1 local_7b8 [16];
  undefined4 local_79c;
  undefined1 local_798 [16];
  undefined4 local_77c;
  undefined1 local_778 [16];
  float local_75c;
  undefined8 local_758;
  undefined8 uStack_750;
  ulong local_748;
  undefined8 uStack_740;
  undefined8 local_738;
  undefined8 uStack_730;
  undefined8 local_728;
  undefined8 uStack_720;
  undefined8 local_718;
  undefined8 uStack_710;
  ulong local_708;
  undefined8 uStack_700;
  undefined8 local_6f8;
  undefined8 uStack_6f0;
  ulong local_6e8;
  undefined8 uStack_6e0;
  undefined8 local_6d8;
  undefined8 uStack_6d0;
  ulong local_6c8;
  undefined8 uStack_6c0;
  ulong local_6b8;
  undefined8 uStack_6b0;
  undefined1 local_6a8 [16];
  undefined8 local_698;
  undefined8 uStack_690;
  undefined4 local_67c;
  ulong local_678;
  undefined8 uStack_670;
  undefined1 local_668 [16];
  undefined4 local_64c;
  undefined1 local_648 [16];
  undefined4 local_62c;
  undefined1 local_628 [16];
  undefined4 local_60c;
  undefined8 local_608;
  undefined8 uStack_600;
  ulong local_5f8;
  undefined8 uStack_5f0;
  undefined8 local_5e8;
  undefined8 uStack_5e0;
  undefined8 local_5d8;
  undefined8 uStack_5d0;
  undefined8 local_5c8;
  undefined8 uStack_5c0;
  ulong local_5b8;
  undefined8 uStack_5b0;
  undefined8 local_5a8;
  undefined8 uStack_5a0;
  undefined8 local_598;
  undefined8 uStack_590;
  undefined8 local_588;
  undefined8 uStack_580;
  ulong local_578;
  undefined8 uStack_570;
  ulong local_568;
  undefined8 uStack_560;
  undefined1 local_558 [16];
  ulong local_548;
  undefined8 uStack_540;
  float local_52c;
  ulong local_528;
  undefined8 uStack_520;
  undefined1 local_518 [16];
  undefined4 local_4fc;
  undefined1 local_4f8 [16];
  undefined4 local_4dc;
  undefined1 local_4d8 [16];
  float local_4bc;
  undefined8 local_4b8;
  undefined8 uStack_4b0;
  ulong local_4a8;
  undefined8 uStack_4a0;
  undefined8 local_498;
  undefined8 uStack_490;
  undefined8 local_488;
  undefined8 uStack_480;
  undefined8 local_478;
  undefined8 uStack_470;
  ulong local_468;
  undefined8 uStack_460;
  undefined8 local_458;
  undefined8 uStack_450;
  ulong local_448;
  undefined8 uStack_440;
  undefined8 local_438;
  undefined8 uStack_430;
  ulong local_428;
  undefined8 uStack_420;
  ulong local_418;
  undefined8 uStack_410;
  undefined8 local_408;
  undefined8 uStack_400;
  ulong local_3f8;
  undefined8 uStack_3f0;
  ulong local_3e8;
  undefined8 uStack_3e0;
  ulong local_3d8;
  undefined8 uStack_3d0;
  ulong local_3c8;
  undefined8 uStack_3c0;
  ulong local_3b8;
  undefined8 uStack_3b0;
  ulong local_3a8;
  undefined8 uStack_3a0;
  ulong local_398;
  undefined8 uStack_390;
  undefined8 local_388;
  undefined8 uStack_380;
  float *local_378;
  undefined1 *local_370;
  float local_368;
  float fStack_364;
  ulong uStack_360;
  undefined1 *local_350;
  undefined8 local_348;
  undefined8 uStack_340;
  undefined4 local_32c;
  undefined8 local_328;
  undefined8 uStack_320;
  undefined4 local_318;
  undefined4 local_314;
  undefined4 local_310;
  undefined4 local_30c;
  undefined8 local_308;
  undefined8 uStack_300;
  float local_2f8;
  float fStack_2f4;
  ulong uStack_2f0;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  undefined8 *local_2d0;
  undefined8 *local_2c8;
  undefined1 *local_2c0;
  undefined8 *local_2b8;
  undefined8 *local_2b0;
  undefined8 *local_2a8;
  undefined8 *local_2a0;
  float local_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  undefined8 *local_280;
  float local_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 *local_250;
  undefined1 *local_248;
  undefined8 *local_240;
  float local_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  undefined8 *local_220;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 *local_1e0;
  undefined8 *local_1d8;
  undefined1 *local_1d0;
  undefined8 *local_1c8;
  undefined8 *local_1c0;
  undefined8 *local_1b8;
  undefined8 *local_1b0;
  float local_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  undefined8 *local_190;
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 *local_160;
  undefined1 *local_158;
  undefined8 *local_150;
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  undefined8 *local_130;
  undefined8 local_128;
  undefined8 uStack_120;
  float *local_f8;
  float *local_f0;
  float *local_e8;
  float *local_e0;
  float *local_d8;
  float *local_d0;
  float *local_c8;
  float *local_c0;
  float *local_b8;
  float *local_b0;
  float *local_a8;
  float *local_a0;
  float *local_98;
  float *local_90;
  float *local_88;
  float *local_80;
  float local_74;
  float local_70;
  float local_6c;
  float *local_68;
  float *local_60;
  float *local_58;
  float *local_50;
  float *local_48;
  float *local_40;
  float *local_38;
  float *local_30;
  float *local_28;
  float *local_20;
  float local_18;
  float local_14;
  float local_10;
  float local_c;
  
  local_2068 = in_RDX + 9;
  local_1c30 = in_RDX[0xb];
  local_1c38 = *local_2068;
  local_1c34 = in_RDX[10];
  local_1c48 = *(undefined8 *)local_2068;
  local_1c2c = 0;
  uStack_1c40 = (ulong)(uint)local_1c30;
  local_1fe0 = local_2278;
  local_1f90 = local_21b4;
  local_1f9c[0] = in_XMM0_Da * *in_RDX;
  local_e8 = local_1f9c;
  local_f0 = &local_1fa0;
  local_f8 = &local_1fa4;
  local_1fc0 = in_RDX + 3;
  local_1fe8 = local_2284;
  local_1fb8 = local_21b8;
  local_1fc4 = in_XMM1_Da * *local_1fc0;
  local_c8 = &local_1fc4;
  local_d0 = &local_1fc8;
  local_d8 = &local_1fcc;
  local_2008 = local_226c;
  local_1fec = local_1f9c[0] + local_1fc4;
  local_a8 = &local_1fec;
  local_b0 = &local_1ff0;
  local_b8 = &local_1ff4;
  local_2010 = in_RDX + 6;
  local_2030 = local_2260;
  local_2014 = local_1fec + *local_2010;
  local_88 = &local_2014;
  local_90 = &local_2018;
  local_98 = &local_201c;
  local_2058 = local_2254;
  local_c = local_201c * local_201c;
  local_18 = local_2018 * local_2018 + local_c;
  local_52c = local_2014 * local_2014 + local_18;
  local_4d8._4_4_ = 0;
  local_4d8._0_4_ = local_52c;
  local_548 = local_4d8._0_8_;
  uStack_540 = 0;
  local_418 = local_4d8._0_8_;
  uStack_410 = 0;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = local_4d8._0_8_;
  local_558 = rsqrtss(auVar8,auVar8);
  local_4dc = 0x3fc00000;
  local_4f8 = ZEXT416(0x3fc00000);
  local_438 = local_558._0_8_;
  uVar2 = local_438;
  uStack_430 = local_558._8_8_;
  local_438._0_4_ = local_558._0_4_;
  local_428 = (ulong)(uint)((float)local_438 * 1.5);
  uStack_420 = 0;
  local_4fc = 0xbf000000;
  local_518 = ZEXT416(0xbf000000);
  local_458 = local_518._0_8_;
  uStack_450 = 0;
  local_448 = (ulong)(uint)(local_52c * -0.5);
  uStack_440 = 0;
  local_478 = local_558._0_8_;
  uStack_470 = local_558._8_8_;
  local_2034 = local_52c * -0.5 * (float)local_438;
  local_468 = (ulong)(uint)local_2034;
  uStack_460 = 0;
  local_498 = local_558._0_8_;
  uStack_490 = local_558._8_8_;
  local_488 = CONCAT44(local_558._4_4_,(float)local_438 * (float)local_438);
  uStack_480 = local_558._8_8_;
  local_4b8 = local_488;
  uStack_4b0 = local_558._8_8_;
  local_2034 = local_2034 * (float)local_438 * (float)local_438;
  local_4a8 = (ulong)(uint)local_2034;
  uStack_4a0 = 0;
  local_3e8 = local_4a8;
  uStack_3e0 = 0;
  local_2034 = (float)local_438 * 1.5 + local_2034;
  local_3d8 = (ulong)(uint)local_2034;
  uStack_3d0 = 0;
  local_568 = local_3d8;
  uStack_560 = 0;
  local_528 = local_3d8;
  uStack_520 = 0;
  local_68 = &local_2034;
  local_1c58 = local_2014 * local_2034;
  fVar10 = local_2018 * local_2034;
  fVar11 = local_201c * local_2034;
  local_40 = &local_6c;
  local_48 = &local_70;
  local_50 = &local_74;
  local_1c68 = CONCAT44(local_70,local_1c58);
  local_1c4c = 0;
  uStack_1c60 = (ulong)(uint)local_74;
  local_1f78 = &inf;
  local_21c8 = in_RCX;
  local_21b0 = in_RSI;
  local_2060 = &local_2238;
  local_2050 = &local_2248;
  local_2028 = local_2058;
  local_201c = local_1ff4 + in_RDX[8];
  local_2018 = local_1ff0 + in_RDX[7];
  local_2000 = local_2030;
  local_1ff4 = local_1fa4 + local_1fcc;
  local_1ff0 = local_1fa0 + local_1fc8;
  local_1fd8 = local_2008;
  local_1fcc = in_XMM1_Da * in_RDX[5];
  local_1fc8 = in_XMM1_Da * in_RDX[4];
  local_1fb0 = local_1fe8;
  local_1fa4 = in_XMM0_Da * in_RDX[2];
  local_1fa0 = in_XMM0_Da * in_RDX[1];
  local_1f88 = local_1fe0;
  local_4d8 = ZEXT416((uint)local_52c);
  local_4bc = local_52c;
  local_438 = uVar2;
  local_e0 = local_1fe0;
  local_c0 = local_1fe8;
  local_a0 = local_2008;
  local_80 = local_2030;
  local_74 = fVar11;
  local_70 = fVar10;
  local_6c = local_1c58;
  local_60 = local_2030;
  local_58 = local_2058;
  local_38 = local_2058;
  local_30 = local_2030;
  local_28 = local_2030;
  local_20 = local_2030;
  local_14 = local_2014;
  local_10 = local_2014;
  local_2284[0] = local_1fc4;
  local_2278[0] = local_1f9c[0];
  local_226c[0] = local_1fec;
  local_2260[0] = local_2014;
  local_2254[0] = local_1c58;
  local_2248 = local_1c68;
  uStack_2240 = uStack_1c60;
  local_2238 = local_1c48;
  uStack_2230 = uStack_1c40;
  local_2208 = std::numeric_limits<float>::infinity();
  local_1f48 = &local_2228;
  local_1f5c = 0;
  local_1f64 = 0;
  local_1f68 = 0xffffffff;
  local_1f6c = 0xffffffff;
  local_1f70 = 0xffffffff;
  local_d6c = 0;
  local_d08 = &local_d88;
  local_d0c = 0xffffffff;
  local_d10 = 0xffffffff;
  local_d14 = 0xffffffff;
  local_d18 = 0;
  local_9cc = 0;
  local_9d0 = 0xffffffff;
  local_9d4 = 0xffffffff;
  local_9d8 = 0xffffffff;
  local_9e8 = 0xffffffffffffffff;
  uStack_9e0 = 0xffffffff;
  local_d88 = 0xffffffffffffffff;
  uStack_d80 = 0xffffffff;
  local_d38 = 0xffffffffffffffff;
  uStack_d30 = 0xffffffff;
  local_ca8 = &local_da8;
  local_da8 = 0xffffffffffffffff;
  uStack_da0 = 0xffffffff;
  local_d58 = local_2238;
  uStack_d50 = uStack_2230;
  local_d48 = &local_db8;
  local_cb8 = &local_dc8;
  local_ad4 = 0;
  local_ab8 = 0;
  local_ac8 = 0;
  uStack_ac4 = 0;
  uStack_ac0 = 0;
  uStack_abc = 0;
  local_828 = 0;
  uStack_820 = 0;
  local_d40 = &local_d98;
  local_8d8 = 0xffffffffffffffff;
  uStack_8d0 = 0xffffffff;
  uStack_c90 = uStack_2230 & 0xffffffff;
  local_818 = 0xffffffffffffffff;
  uStack_810 = 0xffffffff;
  local_968 = 0;
  uStack_960 = 0;
  local_e00 = &local_2218;
  local_e0c = 0;
  local_cf0 = &local_e28;
  local_cf4 = 0xffffffff;
  local_cf8 = 0xffffffff;
  local_cfc = 0xffffffff;
  local_d00 = 0;
  local_9ec = 0;
  local_9f0 = 0xffffffff;
  local_9f4 = 0xffffffff;
  local_9f8 = 0xffffffff;
  local_a08 = 0xffffffffffffffff;
  uStack_a00 = 0xffffffff;
  local_e28 = 0xffffffffffffffff;
  uStack_e20 = 0xffffffff;
  local_dd8 = 0xffffffffffffffff;
  uStack_dd0 = 0xffffffff;
  local_c58 = &local_e48;
  local_e48 = 0xffffffffffffffff;
  uStack_e40 = 0xffffffff;
  local_df8 = local_2248;
  uStack_df0 = uStack_2240;
  local_de8 = &local_e58;
  local_c68 = &local_e68;
  local_ab4 = 0;
  local_a98 = 0;
  local_aa8 = 0;
  uStack_aa4 = 0;
  uStack_aa0 = 0;
  uStack_a9c = 0;
  local_848 = 0;
  uStack_840 = 0;
  local_de0 = &local_e38;
  local_8f8 = 0xffffffffffffffff;
  uStack_8f0 = 0xffffffff;
  uStack_c40 = uStack_2240 & 0xffffffff;
  local_838 = 0xffffffffffffffff;
  uStack_830 = 0xffffffff;
  local_988 = 0;
  uStack_980 = 0;
  local_2204 = 0xffffffff;
  local_d20 = &local_21f8;
  local_21e4 = 0xffffffff;
  local_21e0 = -1;
  local_21dc = 0xffffffff;
  local_21d8 = 0xffffffff;
  local_1f10 = &local_22a8;
  local_22a8 = 0;
  local_22a0 = 0;
  local_2298 = 0;
  local_2290 = 0;
  local_22a4 = 0xa000002;
  local_1f60 = local_2208;
  local_1f58 = &local_2248;
  local_1f50 = &local_2238;
  local_1f08 = local_1f48;
  local_e08 = &local_2248;
  local_d68 = &local_2238;
  local_d60 = local_1f48;
  local_cb0 = local_d48;
  local_ca0 = local_d40;
  local_c98 = local_d58;
  local_c80 = local_d40;
  local_c78 = local_cb8;
  local_c70 = local_d48;
  local_c60 = local_de8;
  local_c50 = local_de0;
  local_c48 = local_df8;
  local_c30 = local_de0;
  local_c28 = local_c68;
  local_c20 = local_de8;
  local_b78 = local_d08;
  local_b70 = local_cf0;
  local_b58 = local_d38;
  uStack_b50 = uStack_d30;
  local_b40 = local_ca8;
  local_b38 = local_dd8;
  uStack_b30 = uStack_dd0;
  local_b20 = local_c58;
  local_ad0 = local_cb8;
  local_ab0 = local_c68;
  local_978 = local_df8;
  uStack_970 = uStack_c40;
  local_958 = local_d58;
  uStack_950 = uStack_c90;
  local_908 = local_df8;
  uStack_900 = uStack_df0;
  local_8e8 = local_d58;
  uStack_8e0 = uStack_d50;
  local_8a8 = local_c58;
  local_8a0 = local_c58;
  local_898 = local_ca8;
  local_890 = local_ca8;
  local_2228 = local_d58;
  uStack_2220 = uStack_c90;
  local_2218 = local_df8;
  uStack_2210 = uStack_c40;
  local_e68 = local_848;
  uStack_e60 = uStack_840;
  local_e58 = local_df8;
  uStack_e50 = uStack_df0;
  local_e38 = local_df8;
  uStack_e30 = uStack_c40;
  local_dc8 = local_828;
  uStack_dc0 = uStack_820;
  local_db8 = local_d58;
  uStack_db0 = uStack_d50;
  local_d98 = local_d58;
  uStack_d90 = uStack_c90;
  rtcTraversableIntersect1(*(undefined8 *)(local_21b0 + 0x20),local_1f48);
  local_1f00 = local_21c8;
  *local_21c8 = *local_21c8 + 1;
  local_1ef4 = 0;
  local_fb8 = 0;
  local_fc8 = 0;
  uStack_fc4 = 0;
  uStack_fc0 = 0;
  uStack_fbc = 0;
  uVar12 = 0;
  *in_RDI = 0;
  in_RDI[1] = 0;
  uVar13 = extraout_XMM1_Qa;
  if (local_21e0 != -1) {
    local_2048 = &local_21f8;
    local_2040 = &local_22b8;
    local_22b8 = CONCAT44(local_21f4,local_21f8);
    local_1c6c = 0;
    uStack_1c80 = (ulong)local_21f0;
    uStack_22b0 = uStack_1c80;
    if (local_21dc != 0xffffffff) {
      lVar1 = *(long *)(local_21b0 + 0x40 + (ulong)local_21dc * 8);
      local_1e78 = (undefined8 *)(lVar1 + 0xa0);
      local_2198 = local_22d8;
      local_21a0 = &local_22b8;
      local_1e70 = &local_22c8;
      local_1e60 = local_1e98;
      local_1e50 = local_1eb8;
      local_1d8 = (undefined8 *)(lVar1 + 0xb0);
      local_1e44 = (float)uStack_22d0;
      local_1e40 = &local_1ed8;
      local_1168 = CONCAT44((float)uStack_22d0,(float)uStack_22d0);
      uStack_1160 = CONCAT44((float)uStack_22d0,(float)uStack_22d0);
      local_11b0 = (undefined8 *)(lVar1 + 0xc0);
      local_11a0 = &local_1ec8;
      local_11a8 = &local_1ed8;
      uVar2 = *local_11b0;
      uVar3 = *(undefined8 *)(lVar1 + 200);
      local_1178._0_4_ = (float)uVar2;
      local_1178._4_4_ = (float)((ulong)uVar2 >> 0x20);
      uStack_1170._0_4_ = (float)uVar3;
      uStack_1170._4_4_ = (float)((ulong)uVar3 >> 0x20);
      local_1198 = (float)uStack_22d0 * (float)local_1178;
      fStack_1194 = (float)uStack_22d0 * local_1178._4_4_;
      fStack_1190 = (float)uStack_22d0 * (float)uStack_1170;
      fStack_118c = (float)uStack_22d0 * uStack_1170._4_4_;
      local_1180 = &local_1ec8;
      local_1c8 = &local_1ea8;
      local_1d0 = local_1eb8;
      local_1e0 = &local_1ec8;
      local_150 = &local_1f8;
      uVar4 = *local_1d8;
      uVar5 = *(undefined8 *)(lVar1 + 0xb8);
      local_128._0_4_ = (float)uVar4;
      local_128._4_4_ = (float)((ulong)uVar4 >> 0x20);
      uStack_120._0_4_ = (float)uVar5;
      uStack_120._4_4_ = (float)((ulong)uVar5 >> 0x20);
      local_148 = fStack_22d4 * (float)local_128;
      fStack_144 = fStack_22d4 * local_128._4_4_;
      fStack_140 = fStack_22d4 * (float)uStack_120;
      fStack_13c = fStack_22d4 * uStack_120._4_4_;
      local_130 = &local_1f8;
      local_178 = CONCAT44(fStack_144,local_148);
      uStack_170 = CONCAT44(fStack_13c,fStack_140);
      local_1b0 = &local_1ea8;
      local_1b8 = &local_1f8;
      local_188 = (float)local_1ec8;
      fStack_184 = (float)((ulong)local_1ec8 >> 0x20);
      fStack_180 = (float)uStack_1ec0;
      fStack_17c = (float)((ulong)uStack_1ec0 >> 0x20);
      local_1a8 = local_148 + local_188;
      fStack_1a4 = fStack_144 + fStack_184;
      fStack_1a0 = fStack_140 + fStack_180;
      fStack_19c = fStack_13c + fStack_17c;
      local_190 = &local_1ea8;
      local_2b8 = &local_22c8;
      local_2c0 = local_1e98;
      local_2d0 = &local_1ea8;
      local_240 = &local_2e8;
      uVar6 = *local_1e78;
      uVar7 = *(undefined8 *)(lVar1 + 0xa8);
      local_218._0_4_ = (float)uVar6;
      local_218._4_4_ = (float)((ulong)uVar6 >> 0x20);
      uStack_210._0_4_ = (float)uVar7;
      uStack_210._4_4_ = (float)((ulong)uVar7 >> 0x20);
      local_238 = local_21f8 * (float)local_218;
      fStack_234 = local_21f8 * local_218._4_4_;
      fStack_230 = local_21f8 * (float)uStack_210;
      fStack_22c = local_21f8 * uStack_210._4_4_;
      local_220 = &local_2e8;
      local_268 = CONCAT44(fStack_234,local_238);
      uStack_260 = CONCAT44(fStack_22c,fStack_230);
      local_2a0 = &local_22c8;
      local_2a8 = &local_2e8;
      local_278 = (float)local_1ea8;
      fStack_274 = (float)((ulong)local_1ea8 >> 0x20);
      fStack_270 = (float)uStack_1ea0;
      fStack_26c = (float)((ulong)uStack_1ea0 >> 0x20);
      local_298 = local_238 + local_278;
      fStack_294 = fStack_234 + fStack_274;
      fStack_290 = fStack_230 + fStack_270;
      fStack_28c = fStack_22c + fStack_26c;
      local_280 = &local_22c8;
      local_22c8 = CONCAT44(fStack_294,local_298);
      uStack_22c0 = CONCAT44(fStack_28c,fStack_290);
      local_20f0 = &local_22b8;
      local_20f8 = &local_22c8;
      local_1e80 = local_2198;
      local_1178 = uVar2;
      uStack_1170 = uVar3;
      local_1048 = local_1e44;
      fStack_1044 = local_1e44;
      fStack_1040 = local_1e44;
      fStack_103c = local_1e44;
      local_1038 = local_1e44;
      local_2c8 = local_1e78;
      local_2b0 = local_2d0;
      local_250 = local_1e78;
      local_248 = local_2c0;
      local_218 = uVar6;
      uStack_210 = uVar7;
      local_1c0 = local_1e0;
      local_160 = local_1d8;
      local_158 = local_1d0;
      local_128 = uVar4;
      uStack_120 = uVar5;
      uStack_22d0 = uStack_1c80;
      local_22b8 = local_22c8;
      uStack_22b0 = uStack_22c0;
      local_1ed8 = local_1168;
      uStack_1ed0 = uStack_1160;
      local_1ec8 = CONCAT44(fStack_1194,local_1198);
      uStack_1ec0 = CONCAT44(fStack_118c,fStack_1190);
      local_1ea8 = CONCAT44(fStack_1a4,local_1a8);
      uStack_1ea0 = CONCAT44(fStack_19c,fStack_1a0);
      local_2e8 = local_268;
      uStack_2e0 = uStack_260;
      local_1f8 = local_178;
      uStack_1f0 = uStack_170;
    }
    local_2168 = &local_2218;
    local_2160 = &local_22f8;
    local_1bc8 = local_2218;
    uStack_1bc0 = uStack_2210;
    local_22f8._0_8_ = local_2218;
    local_22f8._8_8_ = uStack_2210;
    local_1e00 = &local_2308;
    local_1a60 = &local_1df8;
    local_1238 = local_22b8;
    uStack_1230 = uStack_22b0;
    local_1228._0_4_ = (float)local_22b8;
    local_1228._4_4_ = (float)((ulong)local_22b8 >> 0x20);
    uStack_1220._0_4_ = (float)uStack_22b0;
    uStack_1220._4_4_ = (float)(uStack_22b0 >> 0x20);
    local_1258 = (float)local_1228 * (float)local_1228;
    local_1968 = local_1228._4_4_ * local_1228._4_4_;
    local_18e8 = (float)uStack_1220 * (float)uStack_1220;
    fStack_124c = uStack_1220._4_4_ * uStack_1220._4_4_;
    local_1a58 = CONCAT44(local_1968,local_1258);
    uStack_1a50 = CONCAT44(fStack_124c,local_18e8);
    local_1a40 = &local_1a78;
    local_1a30 = &local_1a88;
    local_1988 = CONCAT44(local_1968,local_1968);
    uStack_1980 = CONCAT44(local_1968,local_1968);
    local_1a20 = &local_1a98;
    local_1908 = CONCAT44(local_18e8,local_18e8);
    uStack_1900 = CONCAT44(local_18e8,local_18e8);
    local_19f8 = &local_1ab8;
    local_19b8 = local_1258 + local_1968;
    fStack_19b4 = local_1968 + local_1968;
    fStack_19b0 = local_18e8 + local_1968;
    fStack_19ac = fStack_124c + local_1968;
    local_1888 = CONCAT44(fStack_19b4,local_19b8);
    uStack_1880 = CONCAT44(fStack_19ac,fStack_19b0);
    local_19f0 = &local_1aa8;
    local_19e8 = local_19b8 + local_18e8;
    fStack_19e4 = fStack_19b4 + local_18e8;
    fStack_19e0 = fStack_19b0 + local_18e8;
    fStack_19dc = fStack_19ac + local_18e8;
    local_1a18 = CONCAT44(fStack_19e4,local_19e8);
    uStack_1a10 = CONCAT44(fStack_19dc,fStack_19e0);
    local_778 = ZEXT416((uint)local_19e8);
    local_7e8 = CONCAT44(0,local_19e8);
    uStack_7e0 = 0;
    uStack_3f0 = 0;
    auVar9._8_8_ = 0;
    auVar9._0_8_ = local_7e8;
    local_7f8 = rsqrtss(auVar9,auVar9);
    local_77c = 0x3fc00000;
    local_798 = ZEXT416(0x3fc00000);
    local_6d8 = local_7f8._0_8_;
    uVar2 = local_6d8;
    uStack_6d0 = local_7f8._8_8_;
    local_6d8._0_4_ = local_7f8._0_4_;
    local_6c8 = (ulong)(uint)((float)local_6d8 * 1.5);
    uStack_6c0 = 0;
    local_79c = 0xbf000000;
    local_7b8 = ZEXT416(0xbf000000);
    local_6f8 = local_7b8._0_8_;
    uStack_6f0 = 0;
    local_6e8 = (ulong)(uint)(local_19e8 * -0.5);
    uStack_6e0 = 0;
    local_718 = local_7f8._0_8_;
    uStack_710 = local_7f8._8_8_;
    local_1d8c = local_19e8 * -0.5 * (float)local_6d8;
    local_708 = (ulong)(uint)local_1d8c;
    uStack_700 = 0;
    local_738 = local_7f8._0_8_;
    uStack_730 = local_7f8._8_8_;
    local_728 = CONCAT44(local_7f8._4_4_,(float)local_6d8 * (float)local_6d8);
    uStack_720 = local_7f8._8_8_;
    local_758 = local_728;
    uStack_750 = local_7f8._8_8_;
    local_1d8c = local_1d8c * (float)local_6d8 * (float)local_6d8;
    local_748 = (ulong)(uint)local_1d8c;
    uStack_740 = 0;
    local_3a8 = local_748;
    uStack_3a0 = 0;
    local_1d8c = (float)local_6d8 * 1.5 + local_1d8c;
    local_398 = (ulong)(uint)local_1d8c;
    uStack_390 = 0;
    local_808 = local_398;
    uStack_800 = 0;
    local_7c8 = local_398;
    uStack_7c0 = 0;
    local_1d70 = &local_1da8;
    local_1298 = CONCAT44(local_1d8c,local_1d8c);
    uStack_1290 = CONCAT44(local_1d8c,local_1d8c);
    local_1288 = local_22b8;
    uStack_1280 = uStack_22b0;
    local_12b8 = (float)local_1228 * local_1d8c;
    fStack_12b4 = local_1228._4_4_ * local_1d8c;
    fStack_12b0 = (float)uStack_1220 * local_1d8c;
    fStack_12ac = uStack_1220._4_4_ * local_1d8c;
    local_2308._0_8_ = CONCAT44(fStack_12b4,local_12b8);
    local_2308._8_8_ = CONCAT44(fStack_12ac,fStack_12b0);
    local_1e08 = &local_22b8;
    local_1de8 = &local_22b8;
    local_1de0 = &local_22b8;
    local_1d88 = &local_22b8;
    local_1d80 = local_1e00;
    local_1d74 = local_1d8c;
    local_1bb0 = local_2160;
    local_1a38 = local_1a40;
    local_1a28 = local_1a40;
    local_1a00 = local_1a20;
    local_19d8 = local_19f0;
    local_19d0 = local_1a30;
    local_19c8 = local_1a40;
    local_19c0 = local_19f8;
    local_19a8 = local_19f8;
    local_19a0 = local_19f0;
    local_1998 = local_1a40;
    local_1990 = local_1a30;
    local_1970 = local_1a30;
    fStack_1964 = local_1968;
    fStack_1960 = local_1968;
    fStack_195c = local_1968;
    local_1958 = local_1a58;
    uStack_1950 = uStack_1a50;
    local_1940 = local_1a40;
    local_1938 = local_1a30;
    local_1930 = local_1a40;
    local_1928 = local_1a20;
    local_1920 = local_19f8;
    local_1918 = local_1a40;
    local_1910 = local_1a20;
    local_18f0 = local_1a20;
    fStack_18e4 = local_18e8;
    fStack_18e0 = local_18e8;
    fStack_18dc = local_18e8;
    local_18d8 = local_1a58;
    uStack_18d0 = uStack_1a50;
    local_18c0 = local_1a40;
    local_18b8 = local_1988;
    uStack_18b0 = uStack_1980;
    local_18a8 = local_1a58;
    uStack_18a0 = uStack_1a50;
    local_1898 = local_1908;
    uStack_1890 = uStack_1900;
    local_12d0 = local_1d70;
    local_12c8 = &local_22b8;
    local_12c0 = local_1e00;
    local_12a0 = local_1e00;
    local_1270 = &local_22b8;
    local_1268 = &local_22b8;
    local_1260 = local_1a60;
    fStack_1254 = local_1968;
    fStack_1250 = local_18e8;
    local_1240 = local_1a60;
    local_1228 = local_22b8;
    uStack_1220 = uStack_22b0;
    local_1068 = local_1d8c;
    fStack_1064 = local_1d8c;
    fStack_1060 = local_1d8c;
    fStack_105c = local_1d8c;
    local_104c = local_1d8c;
    local_7cc = local_19e8;
    local_75c = local_19e8;
    local_6d8 = uVar2;
    local_3f8 = local_7e8;
    local_1df8 = local_1a58;
    uStack_1df0 = uStack_1a50;
    local_1da8 = local_1298;
    uStack_1da0 = uStack_1290;
    local_1ab8 = local_1888;
    uStack_1ab0 = uStack_1880;
    local_1aa8 = local_1a18;
    uStack_1aa0 = uStack_1a10;
    local_1a98 = local_1908;
    uStack_1a90 = uStack_1900;
    local_1a88 = local_1988;
    uStack_1a80 = uStack_1980;
    local_1a78 = local_1a58;
    uStack_1a70 = uStack_1a50;
    face_forward((embree *)&local_22e8,(Vec3fa *)&local_2160->field_1,(Vec3fa *)&local_1e00->field_1
                );
    local_22b8 = local_22e8;
    uStack_22b0 = uStack_22e0;
    local_1ee0 = &local_2318;
    local_1ee4 = 0;
    local_fd8 = 0;
    local_fe8 = 0;
    uStack_fe4 = 0;
    uStack_fe0 = 0;
    uStack_fdc = 0;
    if (local_21dc == 0) {
      local_2118 = (undefined8 *)(*(long *)(local_21b0 + 0x60) + (ulong)local_21e4 * 0x10);
      local_2110 = &local_2318;
      local_2318 = *local_2118;
      uStack_2310 = local_2118[1];
    }
    else if (local_21dc == 0xffffffff) {
      local_2128 = (undefined8 *)(*(long *)(local_21b0 + 0x60) + (ulong)(local_21e4 + 0x10) * 0x10);
      local_2120 = &local_2318;
      local_2318 = *local_2128;
      uStack_2310 = local_2128[1];
    }
    else {
      local_2138 = (undefined8 *)
                   (*(long *)(local_21b0 + 0x60) + (ulong)(local_21dc * 4 + local_21e0) * 0x10);
      local_2130 = &local_2318;
      local_2318 = *local_2138;
      uStack_2310 = local_2138[1];
    }
    local_1dc0 = &local_2338;
    local_1cd0 = &local_2318;
    local_1cd4 = 0x3f000000;
    local_1cb8 = &local_1ce8;
    local_1cbc = 0x3f000000;
    local_10ac = 0x3f000000;
    local_10c8 = 0x3f000000;
    uStack_10c4 = 0x3f000000;
    uStack_10c0 = 0x3f000000;
    uStack_10bc = 0x3f000000;
    local_1ce8 = 0x3f0000003f000000;
    uStack_1ce0 = 0x3f0000003f000000;
    local_13b8 = 0x3f0000003f000000;
    uStack_13b0 = 0x3f0000003f000000;
    local_13a8._0_4_ = (float)local_2318;
    local_13a8._4_4_ = (float)((ulong)local_2318 >> 0x20);
    uStack_13a0._0_4_ = (float)uStack_2310;
    uStack_13a0._4_4_ = (float)((ulong)uStack_2310 >> 0x20);
    local_13d8 = (float)local_13a8 * 0.5;
    fStack_13d4 = local_13a8._4_4_ * 0.5;
    fStack_13d0 = (float)uStack_13a0 * 0.5;
    fStack_13cc = uStack_13a0._4_4_ * 0.5;
    local_1b78 = CONCAT44(fStack_13d4,local_13d8);
    uStack_1b70 = CONCAT44(fStack_13cc,fStack_13d0);
    local_2148 = &local_2328;
    uVar13 = *in_RDI;
    uVar12 = in_RDI[1];
    local_1b68._0_4_ = (float)uVar13;
    local_1b68._4_4_ = (float)(uVar13 >> 0x20);
    uStack_1b60._0_4_ = (float)uVar12;
    uStack_1b60._4_4_ = (float)(uVar12 >> 0x20);
    local_1c08 = (float)local_1b68 + local_13d8;
    fStack_1c04 = local_1b68._4_4_ + fStack_13d4;
    fStack_1c00 = (float)uStack_1b60 + fStack_13d0;
    fStack_1bfc = uStack_1b60._4_4_ + fStack_13cc;
    local_2328 = CONCAT44(fStack_1c04,local_1c08);
    uStack_2320 = CONCAT44(fStack_1bfc,fStack_1c00);
    *in_RDI = local_2328;
    in_RDI[1] = uStack_2320;
    local_2180 = &local_2358;
    local_2184 = 0xbf800000;
    local_2188 = 0xbf800000;
    local_218c = 0xbf800000;
    local_1c0c = 0;
    local_1c10 = 0xbf800000;
    local_1c14 = 0xbf800000;
    local_1c18 = 0xbf800000;
    local_1c28 = 0xbf800000bf800000;
    uStack_1c20 = 0xbf800000;
    local_2358 = 0xbf800000bf800000;
    uStack_2350 = 0xbf800000;
    local_1e30 = &local_2348;
    local_1820 = &local_1e28;
    local_11c8 = 0xbf800000bf800000;
    uStack_11c0 = 0xbf800000;
    local_11d8 = 0xbf800000bf800000;
    uStack_11d0 = 0xbf800000;
    local_11f8 = 0x3f800000;
    local_1728 = 0x3f800000;
    local_16a8 = 0x3f800000;
    uStack_11ec = 0;
    local_1818 = 0x3f8000003f800000;
    uStack_1810 = 0x3f800000;
    local_1800 = &local_1838;
    local_17f0 = &local_1848;
    local_1748 = 0x3f8000003f800000;
    uStack_1740 = 0x3f8000003f800000;
    local_17e0 = &local_1858;
    local_16c8 = 0x3f8000003f800000;
    uStack_16c0 = 0x3f8000003f800000;
    local_17b8 = &local_1878;
    local_1778 = 0x40000000;
    uStack_1774 = 0x40000000;
    uStack_1770 = 0x40000000;
    uStack_176c = 0x3f800000;
    local_1648 = 0x4000000040000000;
    uStack_1640 = 0x3f80000040000000;
    local_17b0 = &local_1868;
    local_17a8 = 0x40400000;
    uStack_17a4 = 0x40400000;
    uStack_17a0 = 0x40400000;
    uStack_179c = 0x40000000;
    local_17d8 = 0x4040000040400000;
    uStack_17d0 = 0x4000000040400000;
    local_628 = ZEXT416(0x40400000);
    local_698 = 0x40400000;
    uStack_690 = 0;
    local_408 = 0x40400000;
    uStack_400 = 0;
    local_6a8 = rsqrtss(ZEXT816(0x40400000),ZEXT816(0x40400000));
    local_62c = 0x3fc00000;
    local_648 = ZEXT416(0x3fc00000);
    local_588 = local_6a8._0_8_;
    uVar2 = local_588;
    uStack_580 = local_6a8._8_8_;
    local_588._0_4_ = local_6a8._0_4_;
    local_578 = (ulong)(uint)((float)local_588 * 1.5);
    uStack_570 = 0;
    local_64c = 0xbf000000;
    local_668 = ZEXT416(0xbf000000);
    local_5a8 = local_668._0_8_;
    uStack_5a0 = 0;
    local_598 = 0xbfc00000;
    uStack_590 = 0;
    local_5c8 = local_6a8._0_8_;
    uStack_5c0 = local_6a8._8_8_;
    local_5b8 = (ulong)(uint)((float)local_588 * -1.5);
    uStack_5b0 = 0;
    local_5e8 = local_6a8._0_8_;
    uStack_5e0 = local_6a8._8_8_;
    local_5d8 = CONCAT44(local_6a8._4_4_,(float)local_588 * (float)local_588);
    uStack_5d0 = local_6a8._8_8_;
    local_608 = local_5d8;
    uStack_600 = local_6a8._8_8_;
    local_1d4c = (float)local_588 * -1.5 * (float)local_588 * (float)local_588;
    local_5f8 = (ulong)(uint)local_1d4c;
    uStack_5f0 = 0;
    local_3c8 = local_5f8;
    uStack_3c0 = 0;
    local_1d4c = (float)local_588 * 1.5 + local_1d4c;
    local_3b8 = (ulong)(uint)local_1d4c;
    uStack_3b0 = 0;
    local_6b8 = local_3b8;
    uStack_6b0 = 0;
    local_678 = local_3b8;
    uStack_670 = 0;
    local_1d30 = &local_1d68;
    local_12f8 = CONCAT44(local_1d4c,local_1d4c);
    uStack_12f0 = CONCAT44(local_1d4c,local_1d4c);
    local_12e8 = 0xbf800000bf800000;
    uStack_12e0 = 0xbf800000;
    local_1318 = local_1d4c * -1.0;
    fStack_1314 = local_1d4c * -1.0;
    fStack_1310 = local_1d4c * -1.0;
    fStack_130c = local_1d4c * 0.0;
    uStack_2f0 = CONCAT44(fStack_130c,fStack_1310);
    local_208c = local_2208 * 0.999;
    local_2098 = &local_2218;
    local_20c0 = &local_23e8;
    local_1b88 = &local_20a8;
    local_1b08 = CONCAT44(local_208c,local_208c);
    uStack_1b00 = CONCAT44(local_208c,local_208c);
    local_1b18._0_4_ = (float)local_2218;
    local_1b18._4_4_ = (float)((ulong)local_2218 >> 0x20);
    uStack_1b10._0_4_ = (float)uStack_2210;
    uStack_1b10._4_4_ = (float)(uStack_2210 >> 0x20);
    local_1af8 = local_208c * (float)local_1b18;
    fStack_1af4 = local_208c * local_1b18._4_4_;
    fStack_1af0 = local_208c * (float)uStack_1b10;
    fStack_1aec = local_208c * uStack_1b10._4_4_;
    local_1b38 = CONCAT44(fStack_1af4,local_1af8);
    uStack_1b30 = CONCAT44(fStack_1aec,fStack_1af0);
    local_2178 = &local_23d8;
    local_20b8 = &local_2228;
    local_1b28._0_4_ = (float)local_2228;
    local_1b28._4_4_ = (float)((ulong)local_2228 >> 0x20);
    uStack_1b20._0_4_ = (float)uStack_2220;
    uStack_1b20._4_4_ = (float)(uStack_2220 >> 0x20);
    local_1ad8 = (float)local_1b28 + local_1af8;
    fStack_1ad4 = local_1b28._4_4_ + fStack_1af4;
    fStack_1ad0 = (float)uStack_1b20 + fStack_1af0;
    fStack_1acc = uStack_1b20._4_4_ + fStack_1aec;
    local_1ba8 = CONCAT44(fStack_1ad4,local_1ad8);
    uStack_1ba0 = CONCAT44(fStack_1acc,fStack_1ad0);
    local_32c = 0x80000000;
    local_30c = 0x80000000;
    local_310 = 0x80000000;
    local_314 = 0x80000000;
    local_318 = 0x80000000;
    local_388 = 0x8000000080000000;
    uStack_380 = 0x8000000080000000;
    local_368 = -local_1318;
    fStack_364 = -fStack_1314;
    uStack_360 = uStack_2f0 ^ 0x8000000080000000;
    local_1f80 = &inf;
    local_2170 = &local_23c8;
    local_2108 = (embree *)&local_22e8;
    local_2100 = &local_22b8;
    local_20b0 = local_2178;
    local_2088 = local_20c0;
    local_1e38 = local_2180;
    local_1e18 = local_2180;
    local_1e10 = local_2180;
    local_1db0 = local_2148;
    local_1d48 = local_2180;
    local_1d40 = local_1e30;
    local_1d34 = local_1d4c;
    local_1cc8 = local_1dc0;
    local_1cb0 = local_1e30;
    local_1ca8 = local_23f8;
    local_1bf0 = local_2148;
    local_1b98 = &local_23c8;
    local_1b90 = local_2098;
    local_1b80 = local_20c0;
    local_1b68 = uVar13;
    uStack_1b60 = uVar12;
    local_1b28 = local_2228;
    uStack_1b20 = uStack_2220;
    local_1b18 = local_2218;
    uStack_1b10 = uStack_2210;
    local_1ae0 = local_20c0;
    local_1ac0 = local_2178;
    local_17f8 = local_1800;
    local_17e8 = local_1800;
    local_17c0 = local_17e0;
    local_1798 = local_17b0;
    local_1790 = local_17f0;
    local_1788 = local_1800;
    local_1780 = local_17b8;
    local_1768 = local_17b8;
    local_1760 = local_17b0;
    local_1758 = local_1800;
    local_1750 = local_17f0;
    local_1730 = local_17f0;
    uStack_1724 = local_1728;
    uStack_1720 = local_1728;
    uStack_171c = local_1728;
    local_1718 = local_1818;
    uStack_1710 = uStack_1810;
    local_1700 = local_1800;
    local_16f8 = local_17f0;
    local_16f0 = local_1800;
    local_16e8 = local_17e0;
    local_16e0 = local_17b8;
    local_16d8 = local_1800;
    local_16d0 = local_17e0;
    local_16b0 = local_17e0;
    uStack_16a4 = local_16a8;
    uStack_16a0 = local_16a8;
    uStack_169c = local_16a8;
    local_1698 = local_1818;
    uStack_1690 = uStack_1810;
    local_1680 = local_1800;
    local_1678 = local_1748;
    uStack_1670 = uStack_1740;
    local_1668 = local_1818;
    uStack_1660 = uStack_1810;
    local_1658 = local_16c8;
    uStack_1650 = uStack_16c0;
    local_13f0 = local_1cb8;
    local_13e8 = local_1cd0;
    local_13e0 = local_1dc0;
    local_13c0 = local_1dc0;
    local_13a8 = local_2318;
    uStack_13a0 = uStack_2310;
    local_1330 = local_1d30;
    local_1328 = local_2180;
    local_1320 = local_1e30;
    local_1300 = local_1e30;
    local_1210 = local_2180;
    local_1208 = local_2180;
    local_1200 = local_1820;
    uStack_11f4 = local_1728;
    uStack_11f0 = local_16a8;
    local_11e0 = local_1820;
    local_10f4 = local_208c;
    local_10f0 = local_1b88;
    local_10e8 = local_208c;
    fStack_10e4 = local_208c;
    fStack_10e0 = local_208c;
    fStack_10dc = local_208c;
    local_10cc = local_208c;
    local_1088 = local_1d4c;
    fStack_1084 = local_1d4c;
    fStack_1080 = local_1d4c;
    fStack_107c = local_1d4c;
    local_106c = local_1d4c;
    local_67c = local_17a8;
    local_60c = local_17a8;
    local_588 = uVar2;
    local_378 = local_1e30;
    local_370 = local_23f8;
    local_350 = local_23f8;
    local_348 = local_388;
    uStack_340 = uStack_380;
    local_328 = local_388;
    uStack_320 = uStack_380;
    local_308 = local_388;
    uStack_300 = uStack_380;
    uStack_23f0 = uStack_360;
    local_23e8 = local_1b38;
    uStack_23e0 = uStack_1b30;
    local_23d8 = local_1ba8;
    uStack_23d0 = uStack_1ba0;
    local_23c8 = local_1ba8;
    uStack_23c0 = uStack_1ba0;
    uStack_2340 = uStack_2f0;
    local_2338 = local_1b78;
    uStack_2330 = uStack_1b70;
    local_20a8 = local_1b08;
    uStack_20a0 = uStack_1b00;
    local_1e28 = local_1818;
    uStack_1e20 = uStack_1810;
    local_1d68 = local_12f8;
    uStack_1d60 = uStack_12f0;
    local_1878 = local_1648;
    uStack_1870 = uStack_1640;
    local_1868 = local_17d8;
    uStack_1860 = uStack_17d0;
    local_1858 = local_16c8;
    uStack_1850 = uStack_16c0;
    local_1848 = local_1748;
    uStack_1840 = uStack_1740;
    local_1838 = local_1818;
    uStack_1830 = uStack_1810;
    local_2348 = local_1318;
    fStack_2344 = fStack_1314;
    local_2f8 = local_1318;
    fStack_2f4 = fStack_1314;
    local_2398 = std::numeric_limits<float>::infinity();
    local_1f18 = &local_23b8;
    local_1f2c = 0x3a83126f;
    local_1f34 = 0;
    local_1f38 = 0xffffffff;
    local_1f3c = 0xffffffff;
    local_1f40 = 0xffffffff;
    local_eac = 0x3a83126f;
    local_cd8 = &local_ec8;
    local_cdc = 0xffffffff;
    local_ce0 = 0xffffffff;
    local_ce4 = 0xffffffff;
    local_ce8 = 0;
    local_a0c = 0;
    local_a10 = 0xffffffff;
    local_a14 = 0xffffffff;
    local_a18 = 0xffffffff;
    local_a28 = 0xffffffffffffffff;
    uStack_a20 = 0xffffffff;
    local_ec8 = 0xffffffffffffffff;
    uStack_ec0 = 0xffffffff;
    local_e78 = 0xffffffffffffffff;
    uStack_e70 = 0xffffffff;
    local_c08 = &local_ee8;
    local_ee8 = 0xffffffffffffffff;
    uStack_ee0 = 0xffffffff;
    local_e98 = local_23c8;
    uStack_e90 = uStack_23c0;
    local_e88 = &local_ef8;
    local_c18 = &local_f08;
    local_a94 = 0x3a83126f;
    local_a78 = 0x3a83126f;
    local_a88 = 0x3a83126f;
    uStack_a84 = 0x3a83126f;
    uStack_a80 = 0x3a83126f;
    uStack_a7c = 0x3a83126f;
    local_868 = 0x3a83126f3a83126f;
    uStack_860 = 0x3a83126f3a83126f;
    local_e80 = &local_ed8;
    local_918 = 0xffffffffffffffff;
    uStack_910 = 0xffffffff;
    uStack_990 = uStack_23c0 & 0xffffffff;
    local_858 = 0xffffffffffffffff;
    uStack_850 = 0xffffffff;
    local_9a8 = 0;
    uStack_9a0 = 0x3a83126f00000000;
    uStack_bf0 = uStack_990 | 0x3a83126f00000000;
    local_f40 = local_23a8;
    local_f4c = 0;
    local_cc0 = &local_f68;
    local_cc4 = 0xffffffff;
    local_cc8 = 0xffffffff;
    local_ccc = 0xffffffff;
    local_cd0 = 0;
    local_a2c = 0;
    local_a30 = 0xffffffff;
    local_a34 = 0xffffffff;
    local_a38 = 0xffffffff;
    local_a48 = 0xffffffffffffffff;
    uStack_a40 = 0xffffffff;
    local_f68 = 0xffffffffffffffff;
    uStack_f60 = 0xffffffff;
    local_f18 = 0xffffffffffffffff;
    uStack_f10 = 0xffffffff;
    local_bb8 = &local_f88;
    local_f88 = 0xffffffffffffffff;
    uStack_f80 = 0xffffffff;
    uStack_f30 = uStack_23f0;
    local_f28 = local_f98;
    local_bc8 = &local_fa8;
    local_a74 = 0;
    local_a4c = 0;
    local_a68 = 0;
    uStack_a64 = 0;
    uStack_a60 = 0;
    uStack_a5c = 0;
    local_888 = 0;
    uStack_880 = 0;
    local_bb0 = local_f78;
    local_938 = 0xffffffffffffffff;
    uStack_930 = 0xffffffff;
    uStack_ba0 = uStack_23f0 & 0xffffffff;
    local_878 = 0xffffffffffffffff;
    uStack_870 = 0xffffffff;
    local_9c8 = 0;
    uStack_9c4 = 0;
    uStack_9c0 = 0;
    uStack_9bc = 0;
    local_b90 = local_f78;
    local_f20 = local_f78;
    local_2394 = 0xffffffff;
    local_d28 = auStack_2388;
    local_2374 = 0xffffffff;
    local_2370 = 0xffffffff;
    local_236c = 0xffffffff;
    local_2368 = 0xffffffff;
    local_1ca0 = &local_2418;
    local_2418 = 0;
    local_2410 = 0;
    local_2408 = 0;
    local_2400 = 0;
    local_2414 = 0xa000002;
    local_1c98 = &local_23b8;
    local_1f30 = local_2398;
    local_1f28 = local_23f8;
    local_1f20 = &local_23c8;
    local_f48 = local_23f8;
    local_ea8 = &local_23c8;
    local_ea0 = local_1f18;
    local_c10 = local_e88;
    local_c00 = local_e80;
    local_bf8 = local_e98;
    local_be0 = local_e80;
    local_bd8 = local_c18;
    local_bd0 = local_e88;
    local_bc0 = local_f28;
    local_b88 = local_bc8;
    local_b80 = local_f28;
    local_b68 = local_cd8;
    local_b60 = local_cc0;
    local_b18 = local_e78;
    uStack_b10 = uStack_e70;
    local_b00 = local_c08;
    local_af8 = local_f18;
    uStack_af0 = uStack_f10;
    local_ae0 = local_bb8;
    local_a90 = local_c18;
    local_a70 = local_bc8;
    uStack_9b0 = uStack_ba0;
    local_998 = local_e98;
    uStack_940 = uStack_f30;
    local_928 = local_e98;
    uStack_920 = uStack_e90;
    local_8c8 = local_bb8;
    local_8c0 = local_bb8;
    local_8b8 = local_c08;
    local_8b0 = local_c08;
    local_23b8 = local_e98;
    uStack_23b0 = uStack_bf0;
    uStack_23a0 = uStack_ba0;
    local_fa8 = local_888;
    uStack_fa0 = uStack_880;
    uStack_f90 = uStack_f30;
    uStack_f70 = uStack_ba0;
    local_f08 = local_868;
    uStack_f00 = uStack_860;
    local_ef8 = local_e98;
    uStack_ef0 = uStack_e90;
    local_ed8 = local_e98;
    uStack_ed0 = uStack_bf0;
    rtcTraversableOccluded1(*(undefined8 *)(local_21b0 + 0x20),local_1c98,&local_2418);
    *local_21c8 = *local_21c8 + 1;
    uVar12 = (ulong)(uint)local_2398;
    uVar13 = 0;
    if (0.0 <= local_2398) {
      fStack_1100 = (float)uStack_2340;
      local_1118 = (float)local_22b8;
      fStack_1114 = (float)((ulong)local_22b8 >> 0x20);
      fStack_1110 = (float)uStack_22b0;
      fVar10 = -(local_2348 * local_1118 + fStack_2344 * fStack_1114 + fStack_1100 * fStack_1110);
      local_249c = 1.0;
      if (fVar10 < 1.0) {
        local_249c = fVar10;
      }
      local_24a0 = 0.0;
      if (0.0 <= local_249c) {
        local_24a0 = local_249c;
      }
      local_1348 = (float)local_2318;
      fStack_1344 = (float)((ulong)local_2318 >> 0x20);
      fStack_1340 = (float)uStack_2310;
      fStack_133c = (float)((ulong)uStack_2310 >> 0x20);
      uVar13 = *in_RDI;
      local_1b48 = (float)uVar13;
      fStack_1b44 = (float)(uVar13 >> 0x20);
      fStack_1b40 = (float)in_RDI[1];
      fStack_1b3c = (float)(in_RDI[1] >> 0x20);
      uVar12 = CONCAT44(fStack_1b44 + fStack_1344 * local_24a0,local_1b48 + local_1348 * local_24a0)
      ;
      *in_RDI = uVar12;
      in_RDI[1] = CONCAT44(fStack_1b3c + fStack_133c * local_24a0,
                           fStack_1b40 + fStack_1340 * local_24a0);
    }
  }
  VVar14.field_0._8_8_ = uVar13;
  VVar14.field_0._0_8_ = uVar12;
  return (Vec3fa)VVar14.field_0;
}

Assistant:

Vec3fa renderPixelStandard(const TutorialData& data,
                          float x, float y, const ISPCCamera& camera,
                          RayStats& stats)
{
  /* initialize ray */
  Ray ray(Vec3fa(camera.xfm.p), 
                     Vec3fa(normalize(x*camera.xfm.l.vx + y*camera.xfm.l.vy + camera.xfm.l.vz)), 
                     0.0f, inf, 0.0f, -1,
                     RTC_INVALID_GEOMETRY_ID, RTC_INVALID_GEOMETRY_ID);

  /* intersect ray with scene */
  RTCIntersectArguments iargs;
  rtcInitIntersectArguments(&iargs);
#if USE_ARGUMENT_CALLBACKS
  iargs.filter = contextFilterFunction;
#endif
#if USE_ARGUMENT_CALLBACKS
  iargs.intersect = contextIntersectFunc;
#endif
  iargs.feature_mask = (RTCFeatureFlags) (FEATURE_MASK);
  
  rtcTraversableIntersect1(data.g_traversable,RTCRayHit_(ray),&iargs);
  RayStats_addRay(stats);

  /* shade pixels */
  Vec3fa color = Vec3fa(0.0f);
  if (ray.geomID != RTC_INVALID_GEOMETRY_ID)
  {
    /* calculate shading normal in world space */
    Vec3fa Ns = ray.Ng;

    if (ray.instID[0] != RTC_INVALID_GEOMETRY_ID) {
      Ns = xfmVector(data.g_instance[ray.instID[0]]->normal2world,Vec3fa(Ns));
    }
    Ns = face_forward(ray.dir,normalize(Ns));

    /* calculate diffuse color of geometries */
    Vec3fa diffuse = Vec3fa(0.0f);
    if      (ray.instID[0] ==  0) diffuse = data.colors[4*ray.instID[0]+ray.primID];
    else if (ray.instID[0] == -1) diffuse = data.colors[4*4+ray.primID];
    else                          diffuse = data.colors[4*ray.instID[0]+ray.geomID];
    color = color + diffuse*0.5f;

    /* initialize shadow ray */
    Vec3fa lightDir = normalize(Vec3fa(-1,-1,-1));
    Ray shadow(ray.org + 0.999f*ray.tfar*ray.dir, neg(lightDir), 0.001f, inf);

    /* trace shadow ray */
    RTCOccludedArguments sargs;
    rtcInitOccludedArguments(&sargs);
#if USE_ARGUMENT_CALLBACKS
    sargs.filter = contextFilterFunction;
#endif
#if USE_ARGUMENT_CALLBACKS
    sargs.occluded = contextOccludedFunc;
#endif
    sargs.feature_mask = (RTCFeatureFlags) (FEATURE_MASK);
    
    rtcTraversableOccluded1(data.g_traversable,RTCRay_(shadow),&sargs);
    RayStats_addShadowRay(stats);

    /* add light contribution */
    if (shadow.tfar >= 0.0f)
      color = color + diffuse*clamp(-dot(lightDir,Ns),0.0f,1.0f);
  }
  return color;
}